

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O1

void __thiscall
ObjTypeSpecFldInfoArray::EnsureArray
          (ObjTypeSpecFldInfoArray *this,Recycler *recycler,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *__s;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b2,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) goto LAB_0061946c;
    *puVar5 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b3,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar2) goto LAB_0061946c;
    *puVar5 = 0;
  }
  uVar3 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b4,"(functionBody->GetInlineCacheCount() != 0)",
                       "functionBody->GetInlineCacheCount() != 0");
    if (!bVar2) goto LAB_0061946c;
    *puVar5 = 0;
  }
  if ((this->infoArray).ptr == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar3 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
    data.plusSize = (size_t)uVar3;
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_1cb532c;
    data.filename._0_4_ = 0x4bc;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    uVar3 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
    if (uVar3 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      __s = (WriteBarrierPtr<ObjTypeSpecFldInfo> *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_0061946c;
        *puVar5 = 0;
      }
      __s = (WriteBarrierPtr<ObjTypeSpecFldInfo> *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                      (this_00,(ulong)uVar3 << 3);
      if (__s == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_0061946c;
        *puVar5 = 0;
      }
      memset(__s,0,(ulong)uVar3 << 3);
    }
    Memory::Recycler::WBSetBit((char *)this);
    (this->infoArray).ptr = __s;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    uVar3 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
    this->infoCount = uVar3;
  }
  else {
    uVar3 = Js::FunctionBody::GetCountField(functionBody,InlineCacheCount);
    if (uVar3 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4b8,"(functionBody->GetInlineCacheCount() == this->infoCount)",
                         "functionBody->GetInlineCacheCount() == this->infoCount");
      if (!bVar2) {
LAB_0061946c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void ObjTypeSpecFldInfoArray::EnsureArray(Recycler *const recycler, Js::FunctionBody *const functionBody)
{
    Assert(recycler != nullptr);
    Assert(functionBody != nullptr);
    Assert(functionBody->GetInlineCacheCount() != 0);

    if (this->infoArray)
    {
        Assert(functionBody->GetInlineCacheCount() == this->infoCount);
        return;
    }

    this->infoArray = RecyclerNewArrayZ(recycler, Field(ObjTypeSpecFldInfo*), functionBody->GetInlineCacheCount());
#if DBG
    this->infoCount = functionBody->GetInlineCacheCount();
#endif
}